

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_concat.cpp
# Opt level: O3

void duckdb::StructConcatFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  pointer pVVar1;
  pointer puVar2;
  bool bVar3;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *pvVar4;
  reference this_00;
  pointer this_01;
  type other;
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *child_col;
  pointer this_02;
  Vector *arg;
  pointer vector;
  size_type __n;
  
  this = StructVector::GetEntries(result);
  bVar3 = DataChunk::AllConstant(args);
  if (!bVar3) {
    DataChunk::Flatten(args);
  }
  vector = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar1 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (vector != pVVar1) {
    __n = 0;
    do {
      pvVar4 = StructVector::GetEntries(vector);
      puVar2 = (pvVar4->
               super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
               ).
               super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (this_02 = (pvVar4->
                     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ).
                     super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; this_02 != puVar2;
          this_02 = this_02 + 1) {
        this_00 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  ::operator[](this,__n);
        this_01 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                            (this_00);
        other = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          (this_02);
        Vector::Reference(this_01,other);
        __n = __n + 1;
      }
      vector = vector + 1;
    } while (vector != pVVar1);
  }
  bVar3 = DataChunk::AllConstant(args);
  if (bVar3) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  Vector::Verify(result,args->count);
  return;
}

Assistant:

static void StructConcatFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &result_cols = StructVector::GetEntries(result);
	idx_t offset = 0;

	if (!args.AllConstant()) {
		// Unless all arguments are constant, we flatten the input to make sure it's homogeneous
		args.Flatten();
	}

	for (auto &arg : args.data) {
		const auto &child_cols = StructVector::GetEntries(arg);
		for (auto &child_col : child_cols) {
			result_cols[offset++]->Reference(*child_col);
		}
	}
	D_ASSERT(offset == result_cols.size());

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}

	result.Verify(args.size());
}